

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void addps_VW(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  bool bVar4;
  
  if ((pMyDisasm->Reserved_).PrefRepne == 1) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      bVar4 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
      IVar3 = 0x110002;
      if (bVar4) {
        IVar3 = 0x140002;
      }
      (pMyDisasm->Instruction).Category = IVar3;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vaddsd",7);
      if (bVar4) {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xcc;
LAB_0011a610:
      GyEy(pMyDisasm);
      return;
    }
    (pMyDisasm->Prefix).RepnePrefix = '\b';
    (pMyDisasm->Instruction).Category = 0x50002;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"addsd",6);
    (pMyDisasm->Reserved_).Register_ = 4;
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    goto LAB_0011a75c;
  }
  if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      bVar4 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
      IVar3 = 0x110002;
      if (bVar4) {
        IVar3 = 0x140002;
      }
      (pMyDisasm->Instruction).Category = IVar3;
      builtin_strncpy(pcVar1,"vaddss",7);
      if (bVar4) {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      goto LAB_0011a610;
    }
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    (pMyDisasm->Instruction).Category = 0x40002;
    builtin_strncpy(pcVar1,"addss",6);
  }
  else {
    UVar2 = (pMyDisasm->Reserved_).VEX.state;
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      if (UVar2 == '\x01') {
        bVar4 = (pMyDisasm->Reserved_).EVEX.state != '\x01';
        IVar3 = 0x110002;
        if (!bVar4) {
          IVar3 = 0x140002;
        }
        (pMyDisasm->Instruction).Category = IVar3;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vaddpd",7);
        if (bVar4) goto LAB_0011a692;
LAB_0011a68b:
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
LAB_0011a692:
        if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
          (pMyDisasm->Reserved_).OperandSize = 0x40;
        }
        ArgsVEX(pMyDisasm);
        return;
      }
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x70;
      (pMyDisasm->Instruction).Category = 0x50002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"addpd",6);
    }
    else {
      if (UVar2 == '\x01') {
        bVar4 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
        IVar3 = 0x110002;
        if (bVar4) {
          IVar3 = 0x140002;
        }
        (pMyDisasm->Instruction).Category = IVar3;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vaddps",7);
        if (!bVar4) goto LAB_0011a692;
        goto LAB_0011a68b;
      }
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"addps",6);
    }
  }
  (pMyDisasm->Reserved_).Register_ = 4;
LAB_0011a75c:
  GxEx(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ addps_VW(PDISASM pMyDisasm)
{
  /* ========= 0xf2 */
  if (GV.PrefRepne == 1) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddsd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg3qword;
      GyEy(pMyDisasm);
    }
    else {
      pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addsd");
      #endif
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg2qword;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
   /* ========= 0xf3 */
  else if (GV.PrefRepe == 1) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddss");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg3dword;
      GyEy(pMyDisasm);
    }
    else {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      GV.MemDecoration = Arg2dword;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addss");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
  /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddpd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
    }
    else {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2_m128d_xmm;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addpd");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
  else {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddps");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
    }
     else {
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addps");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
     }
  }
}